

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O2

void * bit_array_dup(void *array)

{
  void *pvVar1;
  size_t __size;
  
  if (array != (void *)0x0) {
    __size = (*array + 7U >> 3) + 8;
    pvVar1 = malloc(__size);
    if (pvVar1 != (void *)0x0) {
      pvVar1 = memcpy(pvVar1,array,__size);
      return pvVar1;
    }
  }
  return (void *)0x0;
}

Assistant:

void * bit_array_dup(void * array)
{
	if (array)
	{
		size_t * size = (size_t *) array;
		size_t bsize = ((*size + 7) >> 3) + sizeof(*size);
		void * ret = malloc(bsize);
		if (ret) memcpy(ret, array, bsize);
		return ret;
	}
	return NULL;
}